

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall
XipFile::FileEntry::fromstream(FileEntry *this,XipFile *xip,allocmap *m,ReadWriter_ptr *r)

{
  uint32_t *puVar1;
  element_type *peVar2;
  int iVar3;
  uint32_t size;
  undefined4 extraout_var;
  undefined8 *puVar4;
  uint uVar5;
  pointer puVar6;
  uint uVar7;
  size_t __n;
  ByteVector filedata;
  undefined1 local_60 [32];
  ByteVector compressed;
  
  iVar3 = (*((r->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_ReadWriter[6])();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&filedata,CONCAT44(extraout_var,iVar3),(allocator_type *)local_60);
  peVar2 = (r->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar2->_vptr_ReadWriter[2])
            (peVar2,filedata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
             (long)filedata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)filedata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&compressed,
             (long)filedata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)filedata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,(allocator_type *)local_60);
  __n = (long)filedata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)filedata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
  uVar7 = (uint)__n;
  (this->super_XipEntry)._size = uVar7;
  uVar5 = uVar7;
  if (__n != 0) {
    memmove(compressed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start,
            filedata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start,__n);
    uVar5 = (this->super_XipEntry)._size;
  }
  this->_compsize = uVar7;
  if (uVar7 == 0 || uVar5 <= uVar7) {
    this->_compsize = uVar5;
    puVar6 = filedata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = uVar5;
  }
  else {
    puVar1 = &(this->super_XipEntry)._attr;
    *puVar1 = *puVar1 | 0x800;
    puVar6 = compressed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  size = allocmap::findfree(m,(uVar7 - 1 | 3) + 1);
  this->_rvaload = size;
  if (size != 0) {
    getrvareader((XipFile *)local_60,(uint32_t)xip,size);
    (**(code **)(*(_func_int **)local_60._0_8_ + 0x18))(local_60._0_8_,puVar6,this->_compsize);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&compressed.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&filedata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return;
  }
  XipEntry::name_abi_cxx11_((string *)local_60,&this->super_XipEntry,xip);
  printf("error writing xip:%s - tried to alloc 0x%x bytes\n",local_60._0_8_,(ulong)this->_compsize)
  ;
  std::__cxx11::string::~string((string *)local_60);
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = "xip: could not alloc space for filedata";
  __cxa_throw(puVar4,&char_const*::typeinfo,0);
}

Assistant:

virtual void fromstream(XipFile& xip, allocmap& m, ReadWriter_ptr r)
        {
            ByteVector filedata(r->size());
            r->read(&filedata[0], filedata.size());
            ByteVector compressed(filedata.size());
            _size= filedata.size();
            _compsize= XipFile::compress(&filedata[0], filedata.size(), &compressed[0]);
            const uint8_t *pdata= &compressed[0];
            if (_compsize>=_size || _compsize==0) {
                _compsize= _size;
                pdata= &filedata[0];
            }
            else {
                _attr |= 0x800;   // compressed
            }
            _rvaload= m.findfree(roundsize(_compsize, 4));
            if (_rvaload==0) {
                printf("error writing xip:%s - tried to alloc 0x%x bytes\n", name(xip).c_str(), _compsize);
                throw "xip: could not alloc space for filedata";
            }
            xip.getrvareader(_rvaload, _compsize)->write(pdata, _compsize);
        }